

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkcookie.cpp
# Opt level: O3

QDebug operator<<(QDebug s,QNetworkCookie *cookie)

{
  long *plVar1;
  QNetworkCookie *in_RDX;
  QNetworkCookiePrivate *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QDebugStateSaver saver;
  undefined1 *local_50;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)cookie);
  plVar1 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar1 + 0x30) = 0;
  pQVar2 = (cookie->d).d.ptr;
  QVar3.m_data = (storage_type *)0xf;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<((QTextStream *)pQVar2,(QString *)&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar2->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  QNetworkCookie::toRawForm(&local_48,in_RDX,Full);
  if (local_48.d.ptr == (char *)0x0) {
    local_48.d.ptr = (char *)&QByteArray::_empty;
  }
  QDebug::putByteArray((char *)cookie,(ulong)local_48.d.ptr,(Latin1Content)local_48.d.size);
  pQVar2 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar2->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
    pQVar2 = (cookie->d).d.ptr;
  }
  QTextStream::operator<<((QTextStream *)pQVar2,')');
  pQVar2 = (cookie->d).d.ptr;
  if (*(char *)&(pQVar2->path).d.ptr == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  pQVar2 = (cookie->d).d.ptr;
  (cookie->d).d.ptr = (QNetworkCookiePrivate *)0x0;
  *(QNetworkCookiePrivate **)s.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)s.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug s, const QNetworkCookie &cookie)
{
    QDebugStateSaver saver(s);
    s.resetFormat().nospace();
    s << "QNetworkCookie(" << cookie.toRawForm(QNetworkCookie::Full) << ')';
    return s;
}